

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O0

void __thiscall
JPolComponent_VectorImplementation::PrivClone
          (JPolComponent_VectorImplementation *this,JPolComponent_VectorImplementation *o)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *this_00;
  reference ppPVar4;
  Interface_ProblemToPolicyDiscretePure *pIVar5;
  undefined4 extraout_var;
  ulong uVar6;
  void *pvVar7;
  long in_RSI;
  size_type in_RDI;
  PolicyPureVector *ind_pol;
  Index i;
  const_iterator last;
  const_iterator it;
  JPolComponent_VectorImplementation *in_stack_ffffffffffffff88;
  value_type in_stack_ffffffffffffff90;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_stack_ffffffffffffff98;
  value_type this_01;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_stack_ffffffffffffffa0;
  __normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
  in_stack_ffffffffffffffb8;
  PolicyPureVector *in_stack_ffffffffffffffc0;
  uint local_24;
  __normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
  local_18;
  long local_10;
  
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  local_10 = in_RSI;
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)(in_RDI + 0x30);
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::size
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)(local_10 + 0x30));
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::resize(this_00,in_RDI);
  local_18._M_current =
       (PolicyPureVector **)
       std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::begin
                 ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                  in_stack_ffffffffffffff88);
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::end
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
             in_stack_ffffffffffffff88);
  local_24 = 0;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar2) break;
    in_stack_ffffffffffffff90 = (value_type)operator_new(0x50);
    __gnu_cxx::
    __normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
    ::operator*(&local_18);
    PolicyPureVector::PolicyPureVector
              (in_stack_ffffffffffffffc0,(PolicyPureVector *)in_stack_ffffffffffffffb8._M_current);
    this_01 = in_stack_ffffffffffffff90;
    ppPVar4 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                        ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)
                         (in_RDI + 0x30),(ulong)local_24);
    *ppPVar4 = in_stack_ffffffffffffff90;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::
         __normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
         ::operator++((__normal_iterator<PolicyPureVector_*const_*,_std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>_>
                       *)this_01,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    local_24 = local_24 + 1;
  }
  pIVar5 = GetInterfacePTPDiscretePure(in_stack_ffffffffffffff88);
  iVar3 = (*(pIVar5->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  auVar1._4_4_ = extraout_var;
  auVar1._0_4_ = iVar3;
  auVar1._8_8_ = 0;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  *(void **)(in_RDI + 8) = pvVar7;
  return;
}

Assistant:

void JPolComponent_VectorImplementation::PrivClone(const JPolComponent_VectorImplementation& o)
{
    _m_idc = o._m_idc;
    _m_PTPDP = o._m_PTPDP;
    _m_PTPDPshared = o._m_PTPDPshared;
    _m_indivPols_PolicyPureVector.resize(
            o._m_indivPols_PolicyPureVector.size() );

    vector<PolicyPureVector*>::const_iterator it = 
    o._m_indivPols_PolicyPureVector.begin();
    vector<PolicyPureVector*>::const_iterator last = 
    o._m_indivPols_PolicyPureVector.end();

    Index i=0;
    while(it != last)
    {
        //make a copy of the individual policy
        PolicyPureVector* ind_pol = new PolicyPureVector(**it);
        //store the reference to the new copy 
        _m_indivPols_PolicyPureVector[i] = (ind_pol);
        it++; 
        i++;
    }
    //allocate a new array for temporarily storing indiv. actions
    _m_indivActionIndices = new Index[ GetInterfacePTPDiscretePure()->GetNrAgents() ];
       
}